

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

uintwide_t<128U,_unsigned_int,_void,_false>
math::wide_integer::pow<int,128u,unsigned_int,void,false>
          (uintwide_t<128U,_unsigned_int,_void,_false> *b,int *p)

{
  int *piVar1;
  int *piVar2;
  int v;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  representation_type rVar6;
  long lVar7;
  uint uVar8;
  local_wide_integer_type p_local;
  local_wide_integer_type y;
  uintwide_t<128U,_unsigned_int,_void,_false> local_78;
  value_type_conflict local_68 [4];
  uintwide_t<128U,_unsigned_int,_void,_false> local_58;
  uintwide_t<128U,_unsigned_int,_void,_false> local_48;
  value_type_conflict local_38 [2];
  value_type_conflict avStack_30 [4];
  
  v = *p;
  if (v == 2) {
    uVar4 = *(undefined8 *)(b->values).super_array<unsigned_int,_4UL>.elems;
    uVar5 = *(undefined8 *)((b->values).super_array<unsigned_int,_4UL>.elems + 2);
    local_78.values.super_array<unsigned_int,_4UL>.elems[0] = (value_type_conflict)uVar4;
    local_78.values.super_array<unsigned_int,_4UL>.elems[1] =
         (value_type_conflict)((ulong)uVar4 >> 0x20);
    local_78.values.super_array<unsigned_int,_4UL>.elems[2] = (value_type_conflict)uVar5;
    local_78.values.super_array<unsigned_int,_4UL>.elems[3] =
         (value_type_conflict)((ulong)uVar5 >> 0x20);
    uintwide_t<128U,_unsigned_int,_void,_false>::operator*=(&local_78,b);
  }
  else if (v == 1) {
    uVar4 = *(undefined8 *)(b->values).super_array<unsigned_int,_4UL>.elems;
    uVar5 = *(undefined8 *)((b->values).super_array<unsigned_int,_4UL>.elems + 2);
    local_78.values.super_array<unsigned_int,_4UL>.elems[0] = (value_type_conflict)uVar4;
    local_78.values.super_array<unsigned_int,_4UL>.elems[1] =
         (value_type_conflict)((ulong)uVar4 >> 0x20);
    local_78.values.super_array<unsigned_int,_4UL>.elems[2] = (value_type_conflict)uVar5;
    local_78.values.super_array<unsigned_int,_4UL>.elems[3] =
         (value_type_conflict)((ulong)uVar5 >> 0x20);
  }
  else {
    if (v != 0) {
      local_78.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
      local_78.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
      local_78.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
      local_78.values.super_array<unsigned_int,_4UL>.elems[0] = 1;
      local_48.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
           *(undefined8 *)(b->values).super_array<unsigned_int,_4UL>.elems;
      local_48.values.super_array<unsigned_int,_4UL>.elems._8_8_ =
           *(undefined8 *)((b->values).super_array<unsigned_int,_4UL>.elems + 2);
      uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t<int>
                (&local_58,v,
                 (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
      do {
        if (local_58.values.super_array<unsigned_int,_4UL>.elems[0] == 0) {
          local_68[0] = 0;
          local_68[1] = 0;
          local_68[2] = 0;
          local_68[3] = 0;
          lVar7 = 0xc;
          do {
            if (lVar7 == -4) goto LAB_00134ba2;
            piVar1 = (int *)((long)local_58.values.super_array<unsigned_int,_4UL>.elems + lVar7);
            piVar2 = (int *)((long)local_68 + lVar7);
            lVar7 = lVar7 + -4;
          } while (*piVar1 == *piVar2);
        }
        if ((local_58.values.super_array<unsigned_int,_4UL>.elems[0] & 1) != 0) {
          uintwide_t<128U,_unsigned_int,_void,_false>::operator*=(&local_78,&local_48);
        }
        local_38[0] = local_48.values.super_array<unsigned_int,_4UL>.elems[0];
        local_38[1] = local_48.values.super_array<unsigned_int,_4UL>.elems[1];
        avStack_30[0] = local_48.values.super_array<unsigned_int,_4UL>.elems[2];
        avStack_30[1] = local_48.values.super_array<unsigned_int,_4UL>.elems[3];
        local_68[0] = 0;
        local_68[1] = 0;
        local_68[2] = 0;
        local_68[3] = 0;
        uintwide_t<128U,_unsigned_int,_void,_false>::
        eval_multiply_n_by_n_to_lo_part<unsigned_int_*,_const_unsigned_int_*,_const_unsigned_int_*,_128U,_nullptr>
                  (local_68,(uint *)&local_48,local_38,4);
        local_48.values.super_array<unsigned_int,_4UL>.elems[0] = local_68[0];
        local_48.values.super_array<unsigned_int,_4UL>.elems[1] = local_68[1];
        local_48.values.super_array<unsigned_int,_4UL>.elems[2] = local_68[2];
        local_48.values.super_array<unsigned_int,_4UL>.elems[3] = local_68[3];
        uVar8 = 0;
        lVar7 = 0xc;
        do {
          uVar3 = *(uint *)((long)local_58.values.super_array<unsigned_int,_4UL>.elems + lVar7);
          *(uint *)((long)local_58.values.super_array<unsigned_int,_4UL>.elems + lVar7) =
               uVar3 >> 1 | uVar8;
          uVar8 = uVar3 << 0x1f;
          lVar7 = lVar7 + -4;
        } while (lVar7 != -4);
      } while( true );
    }
    local_78.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
    local_78.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
    local_78.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
    local_78.values.super_array<unsigned_int,_4UL>.elems[0] = 1;
  }
LAB_00134ba2:
  rVar6.super_array<unsigned_int,_4UL>.elems[1] =
       local_78.values.super_array<unsigned_int,_4UL>.elems[1];
  rVar6.super_array<unsigned_int,_4UL>.elems[0] =
       local_78.values.super_array<unsigned_int,_4UL>.elems[0];
  rVar6.super_array<unsigned_int,_4UL>.elems[2] =
       local_78.values.super_array<unsigned_int,_4UL>.elems[2];
  rVar6.super_array<unsigned_int,_4UL>.elems[3] =
       local_78.values.super_array<unsigned_int,_4UL>.elems[3];
  return (representation_type)(representation_type)rVar6.super_array<unsigned_int,_4UL>.elems;
}

Assistant:

constexpr auto pow(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& b, const OtherIntegralTypeP& p) -> uintwide_t<Width2, LimbType, AllocatorType, IsSigned>
  {
    // Calculate (b ^ p).
    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_limb_type         = typename local_wide_integer_type::limb_type;

    local_wide_integer_type result;
    auto p0 = static_cast<local_limb_type>(p);

    if((p0 == static_cast<local_limb_type>(UINT8_C(0))) && (p == static_cast<OtherIntegralTypeP>(0)))
    {
      result = local_wide_integer_type(static_cast<std::uint8_t>(UINT8_C(1)));
    }
    else if((p0 == static_cast<local_limb_type>(UINT8_C(1))) && (p == static_cast<OtherIntegralTypeP>(UINT8_C(1))))
    {
      result = b;
    }
    else if((p0 == static_cast<local_limb_type>(UINT8_C(2))) && (p == static_cast<OtherIntegralTypeP>(UINT8_C(2))))
    {
      result  = b;
      result *= b;
    }
    else
    {
      result = local_wide_integer_type(static_cast<std::uint8_t>(UINT8_C(1)));

      local_wide_integer_type y      (b);
      local_wide_integer_type p_local(p);

      while(((p0 = static_cast<local_limb_type>(p_local)) != static_cast<local_limb_type>(UINT8_C(0))) || (p_local != static_cast<local_wide_integer_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(p0 & static_cast<local_limb_type>(UINT8_C(1))) != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          result *= y;
        }

        y *= y;

        p_local >>= 1U;
      }
    }

    return result;
  }